

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

size_t __thiscall CConnman::GetNodeCount(CConnman *this,ConnectionDirection flags)

{
  long lVar1;
  bool bVar2;
  int in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  CNode **pnode;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range1;
  int nNum;
  const_iterator __end1;
  const_iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock90;
  ConnectionDirection in_stack_ffffffffffffff68;
  ConnectionDirection in_stack_ffffffffffffff6c;
  vector<CNode_*,_std::allocator<CNode_*>_> *in_stack_ffffffffffffff70;
  __normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
  *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  undefined1 fTry;
  int in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff98;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffffa0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffffa8;
  int local_44;
  size_type local_30;
  
  fTry = (undefined1)((uint)in_stack_ffffffffffffff88 >> 0x18);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_RDI,
             in_stack_ffffffffffffff8c,(bool)fTry);
  if (in_ESI == 3) {
    local_30 = std::vector<CNode_*,_std::allocator<CNode_*>_>::size
                         ((vector<CNode_*,_std::allocator<CNode_*>_> *)
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  else {
    local_44 = 0;
    std::vector<CNode_*,_std::allocator<CNode_*>_>::begin(in_stack_ffffffffffffff70);
    std::vector<CNode_*,_std::allocator<CNode_*>_>::end(in_stack_ffffffffffffff70);
    while (bVar2 = __gnu_cxx::
                   operator==<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             (in_stack_ffffffffffffff78,
                              (__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                               *)in_stack_ffffffffffffff70), ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
      ::operator*((__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      CNode::IsInboundConn((CNode *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      bVar2 = operator&(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      if (bVar2) {
        local_44 = local_44 + 1;
      }
      __gnu_cxx::__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
      ::operator++((__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    local_30 = (size_type)local_44;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

size_t CConnman::GetNodeCount(ConnectionDirection flags) const
{
    LOCK(m_nodes_mutex);
    if (flags == ConnectionDirection::Both) // Shortcut if we want total
        return m_nodes.size();

    int nNum = 0;
    for (const auto& pnode : m_nodes) {
        if (flags & (pnode->IsInboundConn() ? ConnectionDirection::In : ConnectionDirection::Out)) {
            nNum++;
        }
    }

    return nNum;
}